

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindowPrivate::leaveInteractiveMode(QMdiSubWindowPrivate *this)

{
  Data *pDVar1;
  QWidget *pQVar2;
  
  if (this->isInRubberBandMode == true) {
    leaveRubberBandMode(this);
  }
  else {
    QWidget::releaseMouse(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
  }
  this->isInInteractiveMode = false;
  this->currentOperation = None;
  updateDirtyRegions(this);
  updateCursor(this);
  pDVar1 = (this->baseWidget).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->baseWidget).wp.value != (QObject *)0x0)) {
    pQVar2 = QWidget::focusWidget((QWidget *)(this->baseWidget).wp.value);
    if (pQVar2 != (QWidget *)0x0) {
      pQVar2 = QWidget::focusWidget((QWidget *)(this->baseWidget).wp.value);
      QWidget::setFocus(pQVar2,OtherFocusReason);
      return;
    }
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::leaveInteractiveMode()
{
    Q_Q(QMdiSubWindow);
#if QT_CONFIG(rubberband)
    if (isInRubberBandMode)
        leaveRubberBandMode();
    else
#endif
        q->releaseMouse();
    isInInteractiveMode = false;
    currentOperation = None;
    updateDirtyRegions();
    updateCursor();
    if (baseWidget && baseWidget->focusWidget())
        baseWidget->focusWidget()->setFocus();
}